

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O2

bool __thiscall
Lib::
FilteredIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/Induction.cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/Induction.cpp:750:15),_false>
::hasNext(FilteredIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:750:15),_false>
          *this)

{
  Option<Lib::VirtualIterator<Inferences::InductionContext>_> *this_00;
  char cVar1;
  byte bVar2;
  bool bVar3;
  __node_base *p_Var4;
  uint uVar5;
  _ElementType next;
  undefined1 local_150 [40];
  Value local_128;
  undefined8 uStack_120;
  InductionContext local_d0;
  InductionContext local_80;
  
  bVar3 = true;
  if ((this->_next).super_OptionBase<Inferences::InductionContext>._isSome == false) {
    local_150._16_8_ = &this->_next;
    local_150._24_8_ = &this->_inn;
    this_00 = &(this->_inn)._current;
    local_150._32_8_ = &(this->_inn)._master._inner;
    while ((this_00->super_OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_>)._isSome
           == true) {
      cVar1 = (**(code **)(*(long *)(this->_inn)._current.
                                    super_OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_>
                                    ._elem._elem + 0x10))();
      if (cVar1 == '\0') {
        bVar3 = FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>
                ::hasNext((FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>
                           *)local_150._32_8_);
        if (bVar3) {
          MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/Induction.cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>
          ::next((MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>
                  *)local_150);
          local_150._8_8_ = local_150._0_8_;
          if ((InductionClauseIterator *)local_150._0_8_ != (InductionClauseIterator *)0x0) {
            *(int *)(local_150._0_8_ + 8) = *(int *)(local_150._0_8_ + 8) + 1;
          }
          OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_>::OptionBase
                    ((OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_> *)
                     &local_128.init,
                     (VirtualIterator<Inferences::InductionContext> *)(local_150 + 8));
        }
        else {
          local_128 = (Value)0x0;
          uStack_120 = 0;
        }
        OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_>::operator=
                  (&this_00->super_OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_>,
                   (OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_> *)
                   &local_128.init);
        OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_>::~OptionBase
                  ((OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_> *)
                   &local_128.init);
        if (bVar3) {
          VirtualIterator<Inferences::InductionContext>::~VirtualIterator
                    ((VirtualIterator<Inferences::InductionContext> *)(local_150 + 8));
          VirtualIterator<Inferences::InductionContext>::~VirtualIterator
                    ((VirtualIterator<Inferences::InductionContext> *)local_150);
        }
      }
      else {
        (**(code **)(*(long *)(this->_inn)._current.
                              super_OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_>.
                              _elem._elem + 0x18))(&local_128);
        Inferences::InductionContext::InductionContext
                  (&local_80,(InductionContext *)&local_128.init);
        Inferences::InductionContext::~InductionContext((InductionContext *)&local_128.init);
        Inferences::InductionContext::InductionContext(&local_d0,&local_80);
        Inferences::InductionContext::~InductionContext(&local_80);
        bVar2 = 0;
        p_Var4 = &local_d0._cls._M_h._M_before_begin;
        uVar5 = 0;
        while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
          bVar2 = bVar2 | (Clause *)p_Var4[1]._M_nxt == *(this->_func).premise;
          uVar5 = uVar5 + (int)((ulong)((long)p_Var4[4]._M_nxt - (long)p_Var4[3]._M_nxt) >> 3);
        }
        if ((bool)(bVar2 & 1 < uVar5)) {
          Inferences::InductionContext::InductionContext(&local_80,&local_d0);
          OptionBase<Inferences::InductionContext>::OptionBase
                    ((OptionBase<Inferences::InductionContext> *)&local_128.init,&local_80);
          OptionBase<Inferences::InductionContext>::operator=
                    ((OptionBase<Inferences::InductionContext> *)local_150._16_8_,
                     (OptionBase<Inferences::InductionContext> *)&local_128.init);
          OptionBase<Inferences::InductionContext>::~OptionBase
                    ((OptionBase<Inferences::InductionContext> *)&local_128.init);
          Inferences::InductionContext::~InductionContext(&local_80);
          Inferences::InductionContext::~InductionContext(&local_d0);
          return true;
        }
        Inferences::InductionContext::~InductionContext(&local_d0);
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool hasNext()
  {
    if(_next.isSome()) {
      return true;
    }
    while(_inn.hasNext()) {
      OWN_ELEMENT_TYPE next = move_if_value<OWN_ELEMENT_TYPE>(_inn.next());
      if(_func(next)) {
        _next = Option<OWN_ELEMENT_TYPE>(move_if_value<OWN_ELEMENT_TYPE>(next));
        return true;
      } else {
        __doDeletion<deleteFilteredOut>{}(_inn);
      }
    }
    return false;
  }